

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

bool __thiscall
metaf::VisibilityGroup::appendVariableMaxFraction
          (VisibilityGroup *this,string *group,IncompleteText next)

{
  bool bVar1;
  type_conflict2 *ptVar2;
  Distance *pDVar3;
  undefined4 in_EDX;
  long in_RDI;
  size_t unaff_retaddr;
  size_t in_stack_00000008;
  undefined8 in_stack_00000010;
  optional<metaf::Distance> t;
  Distance v;
  type_conflict2 denominator;
  type_conflict2 numerator;
  optional<std::pair<unsigned_int,_unsigned_int>_> fraction;
  uint in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  Distance *in_stack_ffffffffffffffa0;
  Distance *in_stack_ffffffffffffffb8;
  type_conflict2 tVar4;
  type_conflict2 tVar5;
  bool local_1;
  
  std::__cxx11::string::length();
  fractionStrToUint((string *)in_stack_00000010,in_stack_00000008,unaff_retaddr);
  bVar1 = std::optional<std::pair<unsigned_int,_unsigned_int>_>::has_value
                    ((optional<std::pair<unsigned_int,_unsigned_int>_> *)0x244ae0);
  if (bVar1) {
    std::optional<std::pair<unsigned_int,_unsigned_int>_>::operator*
              ((optional<std::pair<unsigned_int,_unsigned_int>_> *)0x244af8);
    ptVar2 = std::get<0ul,unsigned_int,unsigned_int>((pair<unsigned_int,_unsigned_int> *)0x244b00);
    tVar5 = *ptVar2;
    std::optional<std::pair<unsigned_int,_unsigned_int>_>::operator*
              ((optional<std::pair<unsigned_int,_unsigned_int>_> *)0x244b10);
    ptVar2 = std::get<1ul,unsigned_int,unsigned_int>((pair<unsigned_int,_unsigned_int> *)0x244b18);
    tVar4 = *ptVar2;
    Distance::Distance(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98
                      );
    bVar1 = Distance::isValue((Distance *)0x244b3a);
    if (bVar1) {
      Distance::fromIntegerAndFraction((Distance *)CONCAT44(tVar5,tVar4),in_stack_ffffffffffffffb8);
      bVar1 = std::optional<metaf::Distance>::has_value((optional<metaf::Distance> *)0x244b66);
      if (bVar1) {
        pDVar3 = std::optional<metaf::Distance>::operator*((optional<metaf::Distance> *)0x244b7b);
        *(undefined8 *)(in_RDI + 0x14) = *(undefined8 *)pDVar3;
        *(undefined8 *)(in_RDI + 0x1c) =
             *(undefined8 *)
              &(pDVar3->dist).super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>._M_engaged;
        *(undefined4 *)(in_RDI + 0x58) = in_EDX;
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool VisibilityGroup::appendVariableMaxFraction(const std::string & group, IncompleteText next) {
	const auto fraction = fractionStrToUint(group, 0, group.length());
	if (!fraction.has_value()) return false;
	const auto numerator = std::get<0>(*fraction);
	const auto denominator = std::get<1>(*fraction);
	const auto v = Distance(numerator, denominator);
	if (!v.isValue()) return false;
	const auto t = Distance::fromIntegerAndFraction(visMax, v);
	if (!t.has_value()) return false;
	visMax = *t;
	incompleteText = next;
	return true;
}